

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenSwitchSetDefaultName(BinaryenExpressionRef expr,char *name)

{
  Name local_28;
  
  if (expr->_id == SwitchId) {
    wasm::Name::Name(&local_28,name);
    *(size_t *)(expr + 3) = local_28.super_IString.str._M_len;
    expr[3].type.id = (uintptr_t)local_28.super_IString.str._M_str;
    return;
  }
  __assert_fail("expression->is<Switch>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x893,"void BinaryenSwitchSetDefaultName(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenSwitchSetDefaultName(BinaryenExpressionRef expr,
                                  const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  // may be null or empty
  static_cast<Switch*>(expression)->default_ = name;
}